

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::StratifiedSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,StratifiedSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  uint64_t uVar9;
  StratifiedSampler *pSVar10;
  pointer pSVar11;
  long lVar12;
  allocator_type local_31;
  polymorphic_allocator<std::byte> local_30;
  
  local_30.memoryResource = alloc.memoryResource;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_31);
  pSVar10 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::StratifiedSampler>
                      (&local_30,(long)n);
  pSVar11 = (__return_storage_ptr__->
            super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar12 = 0; (ulong)(uint)(~(n >> 0x1f) & n) * 0x30 - lVar12 != 0; lVar12 = lVar12 + 0x30) {
    uVar3 = *(undefined8 *)this;
    uVar4 = *(undefined8 *)&this->seed;
    uVar5 = (this->rng).state;
    uVar6 = (this->rng).inc;
    uVar7 = (this->rng).inc;
    TVar8 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
    uVar9 = *(uint64_t *)&this->sampleIndex;
    puVar2 = (uint64_t *)((long)&(pSVar10->rng).state + lVar12);
    *puVar2 = (this->rng).state;
    puVar2[1] = uVar7;
    *(Tuple2<pbrt::Point2,_int> *)(puVar2 + 2) = TVar8;
    puVar2[3] = uVar9;
    puVar1 = (undefined8 *)((long)&pSVar10->xPixelSamples + lVar12);
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
    puVar1[2] = uVar5;
    puVar1[3] = uVar6;
    (pSVar11->
    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    ).bits = (long)&pSVar10->xPixelSamples + lVar12 | 0x2000000000000;
    pSVar11 = pSVar11 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> StratifiedSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    StratifiedSampler *samplerMem =
        (StratifiedSampler *)alloc.allocate_object<StratifiedSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}